

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O1

void __thiscall FFont::FFont(FFont *this,int lump)

{
  this->_vptr_FFont = (_func_int **)&PTR__FFont_00703048;
  (this->Ranges).Array = (FRemapTable *)0x0;
  (this->Ranges).Most = 0;
  (this->Ranges).Count = 0;
  this->Lump = lump;
  this->Chars = (CharData *)0x0;
  this->PatchRemap = (BYTE *)0x0;
  this->Name = (char *)0x0;
  this->Cursor = '_';
  return;
}

Assistant:

FFont::FFont (int lump)
{
	Lump = lump;
	Chars = NULL;
	PatchRemap = NULL;
	Name = NULL;
	Cursor = '_';
}